

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.h
# Opt level: O1

Fad<float> * __thiscall
TPZFMatrix<Fad<float>_>::GetVal
          (Fad<float> *__return_storage_ptr__,TPZFMatrix<Fad<float>_> *this,int64_t row,int64_t col)

{
  uint uVar1;
  Fad<float> *pFVar2;
  MEM_CPY<float> *this_00;
  long lVar3;
  ulong uVar4;
  
  lVar3 = col * (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  pFVar2 = this->fElem;
  __return_storage_ptr__->val_ = pFVar2[lVar3 + row].val_;
  uVar1 = pFVar2[lVar3 + row].dx_.num_elts;
  (__return_storage_ptr__->dx_).num_elts = uVar1;
  (__return_storage_ptr__->dx_).ptr_to_data = (float *)0x0;
  if ((long)(int)uVar1 != 0) {
    uVar4 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar4 = (long)(int)uVar1 << 2;
    }
    this_00 = (MEM_CPY<float> *)operator_new__(uVar4);
    (__return_storage_ptr__->dx_).ptr_to_data = (float *)this_00;
    MEM_CPY<float>::copy
              (this_00,(EVP_PKEY_CTX *)pFVar2[lVar3 + row].dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(ulong)uVar1);
  }
  __return_storage_ptr__->defaultVal = pFVar2[lVar3 + row].defaultVal;
  return __return_storage_ptr__;
}

Assistant:

inline const TVar TPZFMatrix<TVar>::GetVal( const int64_t row, const int64_t col ) const {
    return( fElem[ col*this->fRow + row ] );
}